

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall
wabt::TypeChecker::CheckOpcode1
          (TypeChecker *this,Opcode opcode,Limits *limits,bool has_address_operands)

{
  Result RVar1;
  undefined3 in_register_00000009;
  Type TVar2;
  bool bVar3;
  Opcode local_64;
  Info local_60;
  
  local_64.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_60,&local_64);
  bVar3 = true;
  if (CONCAT31(in_register_00000009,has_address_operands) == 0) {
    Opcode::GetInfo(&local_60,&local_64);
    bVar3 = local_60.memory_size != 0;
  }
  if ((limits == (Limits *)0x0) || (TVar2.enum_ = I64, (limits->is_64 & bVar3) == 0)) {
    TVar2.enum_ = local_60.param_types[0].enum_;
  }
  Opcode::GetInfo(&local_60,&local_64);
  RVar1 = PopAndCheck1Type(this,TVar2,local_60.name);
  if (has_address_operands) {
    Opcode::GetInfo(&local_60,&local_64);
    if ((limits == (Limits *)0x0) || (TVar2.enum_ = I64, limits->is_64 == false)) {
      TVar2.enum_ = local_60.result_type.enum_;
    }
  }
  else {
    Opcode::GetInfo(&local_60,&local_64);
    TVar2.enum_ = local_60.result_type.enum_;
  }
  PushType(this,TVar2);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode1(Opcode opcode,
                                 const Limits* limits,
                                 bool has_address_operands) {
  Result result =
      PopAndCheck1Type(opcode.GetMemoryParam(
                           opcode.GetParamType1(), limits,
                           has_address_operands || opcode.GetMemorySize() != 0),
                       opcode.GetName());
  PushType(has_address_operands
               ? opcode.GetMemoryParam(opcode.GetResultType(), limits, true)
               : opcode.GetResultType());
  return result;
}